

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromString(IEEEFloat *this,StringRef str,roundingMode rounding_mode)

{
  bool bVar1;
  opStatus oVar2;
  ulong uVar3;
  char *pcVar4;
  StringRef s;
  StringRef str_00;
  
  uVar3 = str.Length;
  pcVar4 = str.Data;
  if (uVar3 == 0) {
    __assert_fail("!str.empty() && \"Invalid string length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xa11,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromString(StringRef, roundingMode)"
                 );
  }
  bVar1 = convertFromStringSpecials(this,str);
  if (bVar1) {
    return opOK;
  }
  this->field_0x12 = this->field_0x12 & 0xf7 | (*pcVar4 == '-') << 3;
  if ((*pcVar4 == '-') || (*pcVar4 == '+')) {
    uVar3 = uVar3 - 1;
    if (uVar3 == 0) {
      __assert_fail("slen && \"String has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xa1e,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromString(StringRef, roundingMode)"
                   );
    }
    pcVar4 = pcVar4 + 1;
  }
  if (((1 < uVar3) && (*pcVar4 == '0')) && ((byte)(pcVar4[1] | 0x20U) == 0x78)) {
    if (uVar3 - 2 != 0) {
      s.Length = uVar3 - 2;
      s.Data = pcVar4 + 2;
      oVar2 = convertFromHexadecimalString(this,s,rounding_mode);
      return oVar2;
    }
    __assert_fail("slen - 2 && \"Invalid string\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xa22,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromString(StringRef, roundingMode)"
                 );
  }
  str_00.Length = uVar3;
  str_00.Data = pcVar4;
  oVar2 = convertFromDecimalString(this,str_00,rounding_mode);
  return oVar2;
}

Assistant:

const fltSemantics &APFloatBase::PPCDoubleDouble() {
    return semPPCDoubleDouble;
  }